

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdCountLuts(Kit_DsdNtk_t *pNtk,int nLutSize)

{
  int nLutSize_00;
  Kit_DsdNtk_t *pNtk_00;
  int Id;
  Kit_DsdObj_t *pKVar1;
  int local_20;
  int local_1c;
  int Counter;
  int nLutSize_local;
  Kit_DsdNtk_t *pNtk_local;
  
  local_20 = 0;
  local_1c = nLutSize;
  _Counter = pNtk;
  pKVar1 = Kit_DsdNtkRoot(pNtk);
  if (((uint)*pKVar1 >> 6 & 7) == 1) {
    pNtk_local._4_4_ = 0;
  }
  else {
    pKVar1 = Kit_DsdNtkRoot(_Counter);
    pNtk_00 = _Counter;
    nLutSize_00 = local_1c;
    if (((uint)*pKVar1 >> 6 & 7) == 2) {
      pNtk_local._4_4_ = 0;
    }
    else {
      Id = Abc_Lit2Var((uint)_Counter->Root);
      Kit_DsdCountLuts_rec(pNtk_00,nLutSize_00,Id,&local_20);
      if (local_20 < 1000) {
        pNtk_local._4_4_ = local_20;
      }
      else {
        pNtk_local._4_4_ = -1;
      }
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Kit_DsdCountLuts( Kit_DsdNtk_t * pNtk, int nLutSize )
{
    int Counter = 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_CONST1 )
        return 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_VAR )
        return 0;
    Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pNtk->Root), &Counter );
    if ( Counter >= 1000 )
        return -1;
    return Counter;
}